

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::cmLocalNinjaGenerator
          (cmLocalNinjaGenerator *this,cmGlobalGenerator *gg,cmLocalGenerator *parent,
          Snapshot snapshot)

{
  _Rb_tree_header *p_Var1;
  
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,parent,snapshot);
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalNinjaGenerator_005fa600;
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->ConfigName,"");
  (this->HomeRelativeOutputPath)._M_dataplus._M_p = (pointer)&(this->HomeRelativeOutputPath).field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->HomeRelativeOutputPath);
  p_Var1 = &(this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmLocalGenerator).TargetImplib,0,
             (char *)(this->super_cmLocalGenerator).TargetImplib._M_string_length,0x501cd9);
  return;
}

Assistant:

cmLocalNinjaGenerator::cmLocalNinjaGenerator(cmGlobalGenerator* gg,
                                             cmLocalGenerator* parent,
                                             cmState::Snapshot snapshot)
  : cmLocalGenerator(gg, parent, snapshot)
  , ConfigName("")
  , HomeRelativeOutputPath("")
{
  this->TargetImplib = "$TARGET_IMPLIB";
}